

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O1

void g_tree_foreach(GTree *tree,GTraverseFunc func,gpointer user_data)

{
  guint8 *pgVar1;
  gboolean gVar2;
  GTreeNode *pGVar3;
  GTreeNode *tmp;
  GTreeNode *pGVar4;
  
  pGVar4 = tree->root;
  if (pGVar4 != (GTreeNode *)0x0) {
    for (; pGVar4->left_child != '\0'; pGVar4 = pGVar4->left) {
    }
    while ((pGVar4 != (GTreeNode *)0x0 &&
           (gVar2 = (*func)(pGVar4->key,pGVar4->value,user_data), gVar2 == 0))) {
      pGVar3 = pGVar4->right;
      pgVar1 = &pGVar4->right_child;
      pGVar4 = pGVar3;
      if (*pgVar1 != '\0') {
        for (; pGVar4 = pGVar3, pGVar3->left_child != '\0'; pGVar3 = pGVar3->left) {
        }
      }
    }
  }
  return;
}

Assistant:

void g_tree_foreach (GTree *tree, GTraverseFunc func, gpointer user_data)
{
    GTreeNode *node;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
        return;

    node = g_tree_first_node (tree);

    while (node)
    {
        if ((*func) (node->key, node->value, user_data))
            break;

        node = g_tree_node_next (node);
    }
}